

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O1

void __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::MultiAggregationPS::execute
          (MultiAggregationPS *this,
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *x,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *y,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *s,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *r,
          DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
          *cStatus,DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                   *rStatus,bool isOptimal)

{
  uint *puVar1;
  uint *puVar2;
  int iVar3;
  fpclass_type fVar4;
  pointer pnVar5;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar6;
  undefined8 uVar7;
  int32_t iVar8;
  bool bVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  int32_t iVar12;
  int iVar13;
  cpp_dec_float<50U,_int,_void> *pcVar14;
  long lVar15;
  cpp_dec_float<50U,_int,_void> *pcVar16;
  cpp_dec_float<50U,_int,_void> *pcVar17;
  long lVar18;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_4;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_2;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  scale;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  val;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  aij;
  cpp_dec_float<50U,_int,_void> local_248;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_208;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_200;
  cpp_dec_float<50U,_int,_void> local_1f8;
  cpp_dec_float<50U,_int,_void> local_1b8;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_180;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_178;
  DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
  *local_170;
  cpp_dec_float<50U,_int,_void> local_168;
  cpp_dec_float<50U,_int,_void> local_128;
  uint local_e8 [2];
  uint auStack_e0 [2];
  uint local_d8 [2];
  uint auStack_d0 [2];
  uint local_c8 [4];
  fpclass_type local_b8;
  int32_t iStack_b4;
  undefined8 uStack_b0;
  cpp_dec_float<50U,_int,_void> local_a0;
  cpp_dec_float<50U,_int,_void> local_68;
  
  iVar13 = this->m_i;
  iVar3 = this->m_old_i;
  if (iVar13 != iVar3) {
    pnVar5 = (s->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    *(undefined8 *)(pnVar5[iVar3].m_backend.data._M_elems + 8) =
         *(undefined8 *)(pnVar5[iVar13].m_backend.data._M_elems + 8);
    uVar7 = *(undefined8 *)&pnVar5[iVar13].m_backend.data;
    uVar10 = *(undefined8 *)(pnVar5[iVar13].m_backend.data._M_elems + 2);
    puVar1 = pnVar5[iVar13].m_backend.data._M_elems + 4;
    uVar11 = *(undefined8 *)(puVar1 + 2);
    puVar2 = pnVar5[iVar3].m_backend.data._M_elems + 4;
    *(undefined8 *)puVar2 = *(undefined8 *)puVar1;
    *(undefined8 *)(puVar2 + 2) = uVar11;
    *(undefined8 *)&pnVar5[iVar3].m_backend.data = uVar7;
    *(undefined8 *)(pnVar5[iVar3].m_backend.data._M_elems + 2) = uVar10;
    pnVar5[iVar3].m_backend.exp = pnVar5[iVar13].m_backend.exp;
    pnVar5[iVar3].m_backend.neg = pnVar5[iVar13].m_backend.neg;
    iVar12 = pnVar5[iVar13].m_backend.prec_elem;
    pnVar5[iVar3].m_backend.fpclass = pnVar5[iVar13].m_backend.fpclass;
    pnVar5[iVar3].m_backend.prec_elem = iVar12;
    iVar13 = this->m_i;
    pnVar5 = (y->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    iVar3 = this->m_old_i;
    *(undefined8 *)(pnVar5[iVar3].m_backend.data._M_elems + 8) =
         *(undefined8 *)(pnVar5[iVar13].m_backend.data._M_elems + 8);
    uVar7 = *(undefined8 *)&pnVar5[iVar13].m_backend.data;
    uVar10 = *(undefined8 *)(pnVar5[iVar13].m_backend.data._M_elems + 2);
    puVar1 = pnVar5[iVar13].m_backend.data._M_elems + 4;
    uVar11 = *(undefined8 *)(puVar1 + 2);
    puVar2 = pnVar5[iVar3].m_backend.data._M_elems + 4;
    *(undefined8 *)puVar2 = *(undefined8 *)puVar1;
    *(undefined8 *)(puVar2 + 2) = uVar11;
    *(undefined8 *)&pnVar5[iVar3].m_backend.data = uVar7;
    *(undefined8 *)(pnVar5[iVar3].m_backend.data._M_elems + 2) = uVar10;
    pnVar5[iVar3].m_backend.exp = pnVar5[iVar13].m_backend.exp;
    pnVar5[iVar3].m_backend.neg = pnVar5[iVar13].m_backend.neg;
    iVar12 = pnVar5[iVar13].m_backend.prec_elem;
    pnVar5[iVar3].m_backend.fpclass = pnVar5[iVar13].m_backend.fpclass;
    pnVar5[iVar3].m_backend.prec_elem = iVar12;
    rStatus->data[this->m_old_i] = rStatus->data[this->m_i];
  }
  iVar13 = this->m_j;
  iVar3 = this->m_old_j;
  if (iVar13 != iVar3) {
    pnVar5 = (x->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    *(undefined8 *)(pnVar5[iVar3].m_backend.data._M_elems + 8) =
         *(undefined8 *)(pnVar5[iVar13].m_backend.data._M_elems + 8);
    uVar7 = *(undefined8 *)&pnVar5[iVar13].m_backend.data;
    uVar10 = *(undefined8 *)(pnVar5[iVar13].m_backend.data._M_elems + 2);
    puVar1 = pnVar5[iVar13].m_backend.data._M_elems + 4;
    uVar11 = *(undefined8 *)(puVar1 + 2);
    puVar2 = pnVar5[iVar3].m_backend.data._M_elems + 4;
    *(undefined8 *)puVar2 = *(undefined8 *)puVar1;
    *(undefined8 *)(puVar2 + 2) = uVar11;
    *(undefined8 *)&pnVar5[iVar3].m_backend.data = uVar7;
    *(undefined8 *)(pnVar5[iVar3].m_backend.data._M_elems + 2) = uVar10;
    pnVar5[iVar3].m_backend.exp = pnVar5[iVar13].m_backend.exp;
    pnVar5[iVar3].m_backend.neg = pnVar5[iVar13].m_backend.neg;
    iVar12 = pnVar5[iVar13].m_backend.prec_elem;
    pnVar5[iVar3].m_backend.fpclass = pnVar5[iVar13].m_backend.fpclass;
    pnVar5[iVar3].m_backend.prec_elem = iVar12;
    iVar13 = this->m_j;
    pnVar5 = (r->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    iVar3 = this->m_old_j;
    *(undefined8 *)(pnVar5[iVar3].m_backend.data._M_elems + 8) =
         *(undefined8 *)(pnVar5[iVar13].m_backend.data._M_elems + 8);
    uVar10 = *(undefined8 *)&pnVar5[iVar13].m_backend.data;
    uVar11 = *(undefined8 *)(pnVar5[iVar13].m_backend.data._M_elems + 2);
    puVar1 = pnVar5[iVar13].m_backend.data._M_elems + 4;
    uVar7 = *(undefined8 *)(puVar1 + 2);
    puVar2 = pnVar5[iVar3].m_backend.data._M_elems + 4;
    *(undefined8 *)puVar2 = *(undefined8 *)puVar1;
    *(undefined8 *)(puVar2 + 2) = uVar7;
    *(undefined8 *)&pnVar5[iVar3].m_backend.data = uVar10;
    *(undefined8 *)(pnVar5[iVar3].m_backend.data._M_elems + 2) = uVar11;
    pnVar5[iVar3].m_backend.exp = pnVar5[iVar13].m_backend.exp;
    pnVar5[iVar3].m_backend.neg = pnVar5[iVar13].m_backend.neg;
    iVar12 = pnVar5[iVar13].m_backend.prec_elem;
    pnVar5[iVar3].m_backend.fpclass = pnVar5[iVar13].m_backend.fpclass;
    pnVar5[iVar3].m_backend.prec_elem = iVar12;
    cStatus->data[this->m_old_j] = cStatus->data[this->m_j];
  }
  local_128.fpclass = cpp_dec_float_finite;
  local_128.prec_elem = 10;
  local_128.data._M_elems[0] = 0;
  local_128.data._M_elems[1] = 0;
  local_128.data._M_elems[2] = 0;
  local_128.data._M_elems[3] = 0;
  local_128.data._M_elems[4] = 0;
  local_128.data._M_elems[5] = 0;
  local_128.data._M_elems._24_5_ = 0;
  local_128.data._M_elems[7]._1_3_ = 0;
  local_128.data._M_elems._32_5_ = 0;
  local_128.data._M_elems[9]._1_3_ = 0;
  local_128.exp = 0;
  local_128.neg = false;
  local_208 = x;
  local_200 = y;
  local_180 = s;
  local_178 = r;
  local_170 = cStatus;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)&local_128,0.0);
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::operator[]((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)&local_68,
               &(this->m_row).
                super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ,this->m_j);
  if (0 < (this->m_row).
          super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .memused) {
    lVar18 = 0;
    lVar15 = 0;
    do {
      pNVar6 = (this->m_row).
               super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .m_elem;
      if (*(int *)((long)(&pNVar6->val + 1) + lVar18) != this->m_j) {
        pcVar14 = (cpp_dec_float<50U,_int,_void> *)
                  ((long)(pNVar6->val).m_backend.data._M_elems + lVar18);
        pcVar16 = &(local_208->val).
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start
                   [*(int *)((long)(&pNVar6->val + 1) + lVar18)].m_backend;
        local_248.fpclass = cpp_dec_float_finite;
        local_248.prec_elem = 10;
        local_248.data._M_elems[0] = 0;
        local_248.data._M_elems[1] = 0;
        local_248.data._M_elems[2] = 0;
        local_248.data._M_elems[3] = 0;
        local_248.data._M_elems[4] = 0;
        local_248.data._M_elems[5] = 0;
        local_248.data._M_elems._24_5_ = 0;
        local_248.data._M_elems[7]._1_3_ = 0;
        local_248.data._M_elems._32_5_ = 0;
        local_248.data._M_elems[9]._1_3_ = 0;
        local_248.exp = 0;
        local_248.neg = false;
        pcVar17 = pcVar14;
        if ((&local_248 != pcVar16) && (pcVar17 = pcVar16, pcVar14 != &local_248)) {
          uVar7 = *(undefined8 *)((pcVar14->data)._M_elems + 8);
          local_248.data._M_elems._32_5_ = SUB85(uVar7,0);
          local_248.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar7 >> 0x28);
          local_248.data._M_elems._0_8_ = *(undefined8 *)(pcVar14->data)._M_elems;
          local_248.data._M_elems._8_8_ = *(undefined8 *)((pcVar14->data)._M_elems + 2);
          local_248.data._M_elems._16_8_ = *(undefined8 *)((pcVar14->data)._M_elems + 4);
          uVar7 = *(undefined8 *)((pcVar14->data)._M_elems + 6);
          local_248.data._M_elems._24_5_ = SUB85(uVar7,0);
          local_248.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar7 >> 0x28);
          local_248.exp = *(int *)((long)(&(pNVar6->val).m_backend.data + 1) + lVar18);
          local_248.neg = *(bool *)((long)(&(pNVar6->val).m_backend.data + 1) + lVar18 + 4);
          local_248._48_8_ = *(undefined8 *)((long)(&(pNVar6->val).m_backend.data + 1) + lVar18 + 8)
          ;
        }
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                  (&local_248,pcVar17);
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                  (&local_128,&local_248);
      }
      lVar15 = lVar15 + 1;
      lVar18 = lVar18 + 0x3c;
    } while (lVar15 < (this->m_row).
                      super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .memused);
  }
  uVar7 = *(undefined8 *)((this->m_const).m_backend.data._M_elems + 8);
  local_248.data._M_elems._32_5_ = SUB85(uVar7,0);
  local_248.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar7 >> 0x28);
  uVar7 = *(undefined8 *)(this->m_const).m_backend.data._M_elems;
  uVar10 = *(undefined8 *)((this->m_const).m_backend.data._M_elems + 6);
  local_248.data._M_elems._16_8_ = *(undefined8 *)((this->m_const).m_backend.data._M_elems + 4);
  local_248.data._M_elems._24_5_ = SUB85(uVar10,0);
  local_248.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar10 >> 0x28);
  local_248.data._M_elems[0] = (uint)uVar7;
  local_248.data._M_elems[1] = SUB84(uVar7,4);
  uVar10 = local_248.data._M_elems._0_8_;
  local_248.data._M_elems._8_8_ = *(undefined8 *)((this->m_const).m_backend.data._M_elems + 2);
  local_248.neg = (this->m_const).m_backend.neg;
  local_248.exp = (this->m_const).m_backend.exp;
  fVar4 = (this->m_const).m_backend.fpclass;
  iVar8 = (this->m_const).m_backend.prec_elem;
  local_248.fpclass = fVar4;
  local_248.prec_elem = iVar8;
  if ((local_248.neg == true) &&
     (local_248.data._M_elems[0] = (uint)uVar7,
     local_248.data._M_elems[0] != 0 || fVar4 != cpp_dec_float_finite)) {
    local_248.neg = false;
  }
  uVar11._5_3_ = local_128.data._M_elems[9]._1_3_;
  uVar11._0_5_ = local_128.data._M_elems._32_5_;
  local_1b8.data._M_elems[8] = local_128.data._M_elems[8];
  local_1b8.data._M_elems[9] = SUB84(uVar11,4);
  uVar7._5_3_ = local_128.data._M_elems[7]._1_3_;
  uVar7._0_5_ = local_128.data._M_elems._24_5_;
  local_1b8.data._M_elems[4] = local_128.data._M_elems[4];
  local_1b8.data._M_elems[5] = local_128.data._M_elems[5];
  local_1b8.data._M_elems[6] = local_128.data._M_elems[6];
  local_1b8.data._M_elems[7] = SUB84(uVar7,4);
  local_1b8.data._M_elems[0] = local_128.data._M_elems[0];
  local_1b8.data._M_elems[1] = local_128.data._M_elems[1];
  uVar7 = local_1b8.data._M_elems._0_8_;
  local_1b8.data._M_elems[2] = local_128.data._M_elems[2];
  local_1b8.data._M_elems[3] = local_128.data._M_elems[3];
  local_1b8.exp = local_128.exp;
  local_1b8.neg = local_128.neg;
  local_1b8.fpclass = local_128.fpclass;
  local_1b8.prec_elem = local_128.prec_elem;
  if ((local_128.neg != false) &&
     (local_1b8.data._M_elems[0] = local_128.data._M_elems[0],
     local_1b8.data._M_elems[0] != 0 || local_128.fpclass != cpp_dec_float_finite)) {
    local_1b8.neg = (bool)(local_128.neg ^ 1);
  }
  local_1b8.data._M_elems._0_8_ = uVar7;
  if (local_128.fpclass == cpp_dec_float_NaN || fVar4 == cpp_dec_float_NaN) {
    bVar9 = false;
  }
  else {
    local_248.data._M_elems._0_8_ = uVar10;
    iVar13 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                       (&local_248,&local_1b8);
    bVar9 = 0 < iVar13;
  }
  pcVar14 = &local_1b8;
  if (bVar9) {
    pcVar14 = &local_248;
  }
  local_168.data._M_elems._32_8_ = *(undefined8 *)((pcVar14->data)._M_elems + 8);
  local_168.data._M_elems._0_8_ = *(undefined8 *)(pcVar14->data)._M_elems;
  local_168.data._M_elems._8_8_ = *(undefined8 *)((pcVar14->data)._M_elems + 2);
  local_168.data._M_elems._16_8_ = *(undefined8 *)((pcVar14->data)._M_elems + 4);
  local_168.data._M_elems._24_8_ = *(undefined8 *)((pcVar14->data)._M_elems + 6);
  pcVar14 = &local_1b8;
  if (bVar9) {
    pcVar14 = &local_248;
  }
  local_168.exp = pcVar14->exp;
  pcVar14 = &local_1b8;
  if (bVar9) {
    pcVar14 = &local_248;
  }
  local_168.neg = pcVar14->neg;
  pcVar14 = &local_1b8;
  if (bVar9) {
    pcVar14 = &local_248;
  }
  local_168.fpclass = pcVar14->fpclass;
  pcVar14 = &local_1b8;
  if (bVar9) {
    pcVar14 = &local_248;
  }
  local_168.prec_elem = pcVar14->prec_elem;
  if (local_168.fpclass != cpp_dec_float_NaN) {
    local_248.fpclass = cpp_dec_float_finite;
    local_248.prec_elem = 10;
    local_248.data._M_elems[0] = 0;
    local_248.data._M_elems[1] = 0;
    local_248.data._M_elems[2] = 0;
    local_248.data._M_elems[3] = 0;
    local_248.data._M_elems[4] = 0;
    local_248.data._M_elems[5] = 0;
    local_248.data._M_elems._24_5_ = 0;
    local_248.data._M_elems[7]._1_3_ = 0;
    local_248.data._M_elems._32_5_ = 0;
    local_248.data._M_elems[9]._1_3_ = 0;
    local_248.exp = 0;
    local_248.neg = false;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&local_248,1.0);
    iVar13 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                       (&local_168,&local_248);
    if (iVar13 < 0) {
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&local_168,1.0);
    }
  }
  local_248.fpclass = cpp_dec_float_finite;
  local_248.prec_elem = 10;
  local_248.data._M_elems[0] = 0;
  local_248.data._M_elems[1] = 0;
  local_248.data._M_elems[2] = 0;
  local_248.data._M_elems[3] = 0;
  local_248.data._M_elems[4] = 0;
  local_248.data._M_elems[5] = 0;
  local_248.data._M_elems._24_5_ = 0;
  local_248.data._M_elems[7]._1_3_ = 0;
  local_248.data._M_elems._32_5_ = 0;
  local_248.data._M_elems[9]._1_3_ = 0;
  local_248.exp = 0;
  local_248.neg = false;
  boost::multiprecision::default_ops::
  eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
            (&local_248,&(this->m_const).m_backend,&local_168);
  local_1f8.fpclass = cpp_dec_float_finite;
  local_1f8.prec_elem = 10;
  local_1f8.data._M_elems[0] = 0;
  local_1f8.data._M_elems[1] = 0;
  local_1f8.data._M_elems[2] = 0;
  local_1f8.data._M_elems[3] = 0;
  local_1f8.data._M_elems[4] = 0;
  local_1f8.data._M_elems[5] = 0;
  local_1f8.data._M_elems._24_5_ = 0;
  local_1f8.data._M_elems[7]._1_3_ = 0;
  local_1f8.data._M_elems._32_5_ = 0;
  local_1f8.data._M_elems[9]._1_3_ = 0;
  local_1f8.exp = 0;
  local_1f8.neg = false;
  boost::multiprecision::default_ops::
  eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
            (&local_1f8,&local_128,&local_168);
  local_1b8.data._M_elems[7]._1_3_ = local_248.data._M_elems[7]._1_3_;
  local_1b8.data._M_elems._24_5_ = local_248.data._M_elems._24_5_;
  local_1b8.data._M_elems[0] = local_248.data._M_elems[0];
  local_1b8.data._M_elems[1] = local_248.data._M_elems[1];
  local_1b8.data._M_elems[2] = local_248.data._M_elems[2];
  local_1b8.data._M_elems[3] = local_248.data._M_elems[3];
  local_1b8.data._M_elems[4] = local_248.data._M_elems[4];
  local_1b8.data._M_elems[5] = local_248.data._M_elems[5];
  local_1b8.data._M_elems[9]._1_3_ = local_248.data._M_elems[9]._1_3_;
  local_1b8.data._M_elems._32_5_ = local_248.data._M_elems._32_5_;
  local_1b8.exp = local_248.exp;
  local_1b8.neg = local_248.neg;
  local_1b8.fpclass = local_248.fpclass;
  local_1b8.prec_elem = local_248.prec_elem;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=(&local_1b8,&local_1f8);
  uVar10 = local_1b8._48_8_;
  bVar9 = local_1b8.neg;
  iVar13 = local_1b8.exp;
  local_e8[0] = local_1b8.data._M_elems[0];
  local_e8[1] = local_1b8.data._M_elems[1];
  auStack_e0[0] = local_1b8.data._M_elems[2];
  auStack_e0[1] = local_1b8.data._M_elems[3];
  local_d8[0] = local_1b8.data._M_elems[4];
  local_d8[1] = local_1b8.data._M_elems[5];
  auStack_d0[0] = local_1b8.data._M_elems[6];
  auStack_d0[1] = local_1b8.data._M_elems[7];
  local_c8[0] = local_1b8.data._M_elems[8];
  local_c8[1] = local_1b8.data._M_elems[9];
  local_b8 = local_1b8.fpclass;
  iStack_b4 = local_1b8.prec_elem;
  uStack_b0 = 0;
  (*(this->super_PostStep)._vptr_PostStep[7])(&local_a0,this);
  uVar11 = local_1b8._48_8_;
  local_248.data._M_elems._32_5_ = SUB85(local_c8._0_8_,0);
  local_248.data._M_elems[9]._1_3_ = SUB83(local_c8._0_8_,5);
  local_248.data._M_elems[4] = local_d8[0];
  local_248.data._M_elems[5] = local_d8[1];
  local_248.data._M_elems._24_5_ = auStack_d0._0_5_;
  local_248.data._M_elems[7]._1_3_ = auStack_d0[1]._1_3_;
  local_248.data._M_elems[0] = local_e8[0];
  local_248.data._M_elems[1] = local_e8[1];
  uVar7 = local_248.data._M_elems._0_8_;
  local_248.data._M_elems[2] = auStack_e0[0];
  local_248.data._M_elems[3] = auStack_e0[1];
  local_248.exp = iVar13;
  local_248.neg = bVar9;
  local_1b8.fpclass = (fpclass_type)uVar10;
  local_1b8.prec_elem = SUB84(uVar10,4);
  local_248.fpclass = local_1b8.fpclass;
  local_248.prec_elem = local_1b8.prec_elem;
  if ((bVar9 == true) &&
     (local_248.data._M_elems[0] = local_e8[0],
     local_248.data._M_elems[0] != 0 || local_b8 != cpp_dec_float_finite)) {
    local_248.neg = false;
  }
  local_248.data._M_elems._0_8_ = uVar7;
  local_1b8._48_8_ = uVar11;
  if (((local_b8 != cpp_dec_float_NaN) && (local_a0.fpclass != cpp_dec_float_NaN)) &&
     (iVar13 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                         (&local_248,&local_a0), iVar13 < 1)) {
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&local_1b8,0.0);
  }
  local_1f8.data._M_elems[0] = local_1b8.data._M_elems[0];
  local_1f8.data._M_elems[1] = local_1b8.data._M_elems[1];
  local_1f8.data._M_elems[2] = local_1b8.data._M_elems[2];
  local_1f8.data._M_elems[3] = local_1b8.data._M_elems[3];
  local_1f8.data._M_elems[4] = local_1b8.data._M_elems[4];
  local_1f8.data._M_elems[5] = local_1b8.data._M_elems[5];
  local_1f8.data._M_elems._24_5_ = local_1b8.data._M_elems._24_5_;
  local_1f8.data._M_elems[7]._1_3_ = local_1b8.data._M_elems[7]._1_3_;
  local_1f8.data._M_elems._32_5_ = local_1b8.data._M_elems._32_5_;
  local_1f8.data._M_elems[9]._1_3_ = local_1b8.data._M_elems[9]._1_3_;
  local_1f8.exp = local_1b8.exp;
  local_1f8.neg = local_1b8.neg;
  local_1f8.fpclass = local_1b8.fpclass;
  local_1f8.prec_elem = local_1b8.prec_elem;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=(&local_1f8,&local_168);
  local_248.fpclass = cpp_dec_float_finite;
  local_248.prec_elem = 10;
  local_248.data._M_elems[0] = 0;
  local_248.data._M_elems[1] = 0;
  local_248.data._M_elems[2] = 0;
  local_248.data._M_elems[3] = 0;
  local_248.data._M_elems[4] = 0;
  local_248.data._M_elems[5] = 0;
  local_248.data._M_elems._24_5_ = 0;
  local_248.data._M_elems[7]._1_3_ = 0;
  local_248.data._M_elems._32_5_ = 0;
  local_248.data._M_elems[9]._1_3_ = 0;
  local_248.exp = 0;
  local_248.neg = false;
  boost::multiprecision::default_ops::
  eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
            (&local_248,&local_1f8,&local_68);
  iVar13 = this->m_j;
  pnVar5 = (local_208->val).
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  *(ulong *)(pnVar5[iVar13].m_backend.data._M_elems + 8) =
       CONCAT35(local_248.data._M_elems[9]._1_3_,local_248.data._M_elems._32_5_);
  puVar1 = pnVar5[iVar13].m_backend.data._M_elems + 4;
  *(undefined8 *)puVar1 = local_248.data._M_elems._16_8_;
  *(ulong *)(puVar1 + 2) = CONCAT35(local_248.data._M_elems[7]._1_3_,local_248.data._M_elems._24_5_)
  ;
  *(undefined8 *)&pnVar5[iVar13].m_backend.data = local_248.data._M_elems._0_8_;
  *(undefined8 *)(pnVar5[iVar13].m_backend.data._M_elems + 2) = local_248.data._M_elems._8_8_;
  pnVar5[iVar13].m_backend.exp = local_248.exp;
  pnVar5[iVar13].m_backend.neg = local_248.neg;
  pnVar5[iVar13].m_backend.fpclass = local_248.fpclass;
  pnVar5[iVar13].m_backend.prec_elem = local_248.prec_elem;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)
             ((local_180->val).
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start + this->m_i),0.0);
  local_248.fpclass = cpp_dec_float_finite;
  local_248.prec_elem = 10;
  local_248.data._M_elems[0] = 0;
  local_248.data._M_elems[1] = 0;
  local_248.data._M_elems[2] = 0;
  local_248.data._M_elems[3] = 0;
  local_248.data._M_elems[4] = 0;
  local_248.data._M_elems[5] = 0;
  local_248.data._M_elems._24_5_ = 0;
  local_248.data._M_elems[7]._1_3_ = 0;
  local_248.data._M_elems._32_5_ = 0;
  local_248.data._M_elems[9]._1_3_ = 0;
  local_248.exp = 0;
  local_248.neg = false;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)&local_248,0.0);
  if (0 < (this->m_col).
          super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .memused) {
    lVar18 = 0;
    lVar15 = 0;
    do {
      pNVar6 = (this->m_col).
               super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .m_elem;
      if (*(int *)((long)(&pNVar6->val + 1) + lVar18) != this->m_i) {
        pcVar14 = (cpp_dec_float<50U,_int,_void> *)
                  ((long)(pNVar6->val).m_backend.data._M_elems + lVar18);
        pcVar16 = &(local_200->val).
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start
                   [*(int *)((long)(&pNVar6->val + 1) + lVar18)].m_backend;
        local_1f8.fpclass = cpp_dec_float_finite;
        local_1f8.prec_elem = 10;
        local_1f8.data._M_elems[0] = 0;
        local_1f8.data._M_elems[1] = 0;
        local_1f8.data._M_elems[2] = 0;
        local_1f8.data._M_elems[3] = 0;
        local_1f8.data._M_elems[4] = 0;
        local_1f8.data._M_elems[5] = 0;
        local_1f8.data._M_elems._24_5_ = 0;
        local_1f8.data._M_elems[7]._1_3_ = 0;
        local_1f8.data._M_elems._32_5_ = 0;
        local_1f8.data._M_elems[9]._1_3_ = 0;
        local_1f8.exp = 0;
        local_1f8.neg = false;
        pcVar17 = pcVar14;
        if ((&local_1f8 != pcVar16) && (pcVar17 = pcVar16, pcVar14 != &local_1f8)) {
          uVar7 = *(undefined8 *)((pcVar14->data)._M_elems + 8);
          local_1f8.data._M_elems._32_5_ = SUB85(uVar7,0);
          local_1f8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar7 >> 0x28);
          local_1f8.data._M_elems._0_8_ = *(undefined8 *)(pcVar14->data)._M_elems;
          local_1f8.data._M_elems._8_8_ = *(undefined8 *)((pcVar14->data)._M_elems + 2);
          local_1f8.data._M_elems._16_8_ = *(undefined8 *)((pcVar14->data)._M_elems + 4);
          uVar7 = *(undefined8 *)((pcVar14->data)._M_elems + 6);
          local_1f8.data._M_elems._24_5_ = SUB85(uVar7,0);
          local_1f8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar7 >> 0x28);
          local_1f8.exp = *(int *)((long)(&(pNVar6->val).m_backend.data + 1) + lVar18);
          local_1f8.neg = *(bool *)((long)(&(pNVar6->val).m_backend.data + 1) + lVar18 + 4);
          local_1f8._48_8_ = *(undefined8 *)((long)(&(pNVar6->val).m_backend.data + 1) + lVar18 + 8)
          ;
        }
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                  (&local_1f8,pcVar17);
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                  (&local_248,&local_1f8);
      }
      lVar15 = lVar15 + 1;
      lVar18 = lVar18 + 0x3c;
    } while (lVar15 < (this->m_col).
                      super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .memused);
  }
  local_1f8.fpclass = cpp_dec_float_finite;
  local_1f8.prec_elem = 10;
  local_1f8.data._M_elems[0] = 0;
  local_1f8.data._M_elems[1] = 0;
  local_1f8.data._M_elems[2] = 0;
  local_1f8.data._M_elems[3] = 0;
  local_1f8.data._M_elems[4] = 0;
  local_1f8.data._M_elems[5] = 0;
  local_1f8.data._M_elems._24_5_ = 0;
  local_1f8.data._M_elems[7]._1_3_ = 0;
  local_1f8.data._M_elems._32_5_ = 0;
  local_1f8.data._M_elems[9]._1_3_ = 0;
  local_1f8.exp = 0;
  local_1f8.neg = false;
  if (&local_1f8 != &(this->m_obj).m_backend) {
    uVar7 = *(undefined8 *)((this->m_obj).m_backend.data._M_elems + 8);
    local_1f8.data._M_elems._32_5_ = SUB85(uVar7,0);
    local_1f8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar7 >> 0x28);
    local_1f8.data._M_elems._0_8_ = *(undefined8 *)(this->m_obj).m_backend.data._M_elems;
    local_1f8.data._M_elems._8_8_ = *(undefined8 *)((this->m_obj).m_backend.data._M_elems + 2);
    local_1f8.data._M_elems._16_8_ = *(undefined8 *)((this->m_obj).m_backend.data._M_elems + 4);
    uVar7 = *(undefined8 *)((this->m_obj).m_backend.data._M_elems + 6);
    local_1f8.data._M_elems._24_5_ = SUB85(uVar7,0);
    local_1f8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar7 >> 0x28);
    local_1f8.exp = (this->m_obj).m_backend.exp;
    local_1f8.neg = (this->m_obj).m_backend.neg;
    local_1f8.fpclass = (this->m_obj).m_backend.fpclass;
    local_1f8.prec_elem = (this->m_obj).m_backend.prec_elem;
  }
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=(&local_1f8,&local_248);
  local_1b8.data._M_elems[7]._1_3_ = local_1f8.data._M_elems[7]._1_3_;
  local_1b8.data._M_elems._24_5_ = local_1f8.data._M_elems._24_5_;
  local_1b8.data._M_elems[0] = local_1f8.data._M_elems[0];
  local_1b8.data._M_elems[1] = local_1f8.data._M_elems[1];
  local_1b8.data._M_elems[2] = local_1f8.data._M_elems[2];
  local_1b8.data._M_elems[3] = local_1f8.data._M_elems[3];
  local_1b8.data._M_elems[4] = local_1f8.data._M_elems[4];
  local_1b8.data._M_elems[5] = local_1f8.data._M_elems[5];
  local_1b8.data._M_elems[9]._1_3_ = local_1f8.data._M_elems[9]._1_3_;
  local_1b8.data._M_elems._32_5_ = local_1f8.data._M_elems._32_5_;
  local_1b8.exp = local_1f8.exp;
  local_1b8.neg = local_1f8.neg;
  local_1b8.fpclass = local_1f8.fpclass;
  local_1b8.prec_elem = local_1f8.prec_elem;
  local_1f8.fpclass = cpp_dec_float_finite;
  local_1f8.prec_elem = 10;
  local_1f8.data._M_elems[0] = 0;
  local_1f8.data._M_elems[1] = 0;
  local_1f8.data._M_elems[2] = 0;
  local_1f8.data._M_elems[3] = 0;
  local_1f8.data._M_elems[4] = 0;
  local_1f8.data._M_elems[5] = 0;
  local_1f8.data._M_elems._24_5_ = 0;
  local_1f8.data._M_elems[7]._1_3_ = 0;
  local_1f8.data._M_elems._32_5_ = 0;
  local_1f8.data._M_elems[9]._1_3_ = 0;
  local_1f8.exp = 0;
  local_1f8.neg = false;
  boost::multiprecision::default_ops::
  eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
            (&local_1f8,&local_1b8,&local_68);
  iVar13 = this->m_i;
  pnVar5 = (local_200->val).
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  *(ulong *)(pnVar5[iVar13].m_backend.data._M_elems + 8) =
       CONCAT35(local_1f8.data._M_elems[9]._1_3_,local_1f8.data._M_elems._32_5_);
  puVar1 = pnVar5[iVar13].m_backend.data._M_elems + 4;
  *(undefined8 *)puVar1 = local_1f8.data._M_elems._16_8_;
  *(ulong *)(puVar1 + 2) = CONCAT35(local_1f8.data._M_elems[7]._1_3_,local_1f8.data._M_elems._24_5_)
  ;
  *(undefined8 *)&pnVar5[iVar13].m_backend.data = local_1f8.data._M_elems._0_8_;
  *(undefined8 *)(pnVar5[iVar13].m_backend.data._M_elems + 2) = local_1f8.data._M_elems._8_8_;
  pnVar5[iVar13].m_backend.exp = local_1f8.exp;
  pnVar5[iVar13].m_backend.neg = local_1f8.neg;
  pnVar5[iVar13].m_backend.fpclass = local_1f8.fpclass;
  pnVar5[iVar13].m_backend.prec_elem = local_1f8.prec_elem;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)
             ((local_178->val).
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start + this->m_j),0.0);
  local_170->data[this->m_j] = BASIC;
  if (this->m_eqCons == false) {
    if (this->m_onLhs == true) {
      rStatus->data[this->m_i] = ON_LOWER;
    }
    else {
      rStatus->data[this->m_i] = ON_UPPER;
    }
  }
  else {
    rStatus->data[this->m_i] = FIXED;
  }
  return;
}

Assistant:

void SPxMainSM<R>::MultiAggregationPS::execute(VectorBase<R>& x, VectorBase<R>& y, VectorBase<R>& s,
      VectorBase<R>& r,
      DataArray<typename SPxSolverBase<R>::VarStatus>& cStatus,
      DataArray<typename SPxSolverBase<R>::VarStatus>& rStatus, bool isOptimal) const
{

   // correcting the change of idx by deletion of the row:
   if(m_i != m_old_i)
   {
      s[m_old_i] = s[m_i];
      y[m_old_i] = y[m_i];
      rStatus[m_old_i] = rStatus[m_i];
   }

   // correcting the change of idx by deletion of the column:
   if(m_j != m_old_j)
   {
      x[m_old_j] = x[m_j];
      r[m_old_j] = r[m_j];
      cStatus[m_old_j] = cStatus[m_j];
   }

   // primal:
   R val = 0.0;
   R aij = m_row[m_j];

   for(int k = 0; k < m_row.size(); ++k)
   {
      if(m_row.index(k) != m_j)
         val += m_row.value(k) * x[m_row.index(k)];
   }

   R scale = maxAbs(m_const, val);

   if(scale < 1.0)
      scale = 1.0;

   R z = (m_const / scale) - (val / scale);

   if(isZero(z, this->epsilon()))
      z = 0.0;

   x[m_j] = z * scale / aij;
   s[m_i] = 0.0;

#ifndef NDEBUG

   if(isOptimal && (LT(x[m_j], m_lower, this->feastol()) || GT(x[m_j], m_upper, this->feastol())))
      SPX_MSG_ERROR(std::cerr << "numerical violation in original space due to MultiAggregation\n";)
#endif

      // dual:
      R dualVal = 0.0;

   for(int k = 0; k < m_col.size(); ++k)
   {
      if(m_col.index(k) != m_i)
         dualVal += m_col.value(k) * y[m_col.index(k)];
   }

   z = m_obj - dualVal;

   y[m_i] = z / aij;
   r[m_j] = 0.0;

   // basis:
   cStatus[m_j] = SPxSolverBase<R>::BASIC;

   if(m_eqCons)
      rStatus[m_i] = SPxSolverBase<R>::FIXED;
   else if(m_onLhs)
      rStatus[m_i] = SPxSolverBase<R>::ON_LOWER;
   else
      rStatus[m_i] = SPxSolverBase<R>::ON_UPPER;

#ifdef SOPLEX_CHECK_BASIS_DIM

   if(!this->checkBasisDim(rStatus, cStatus))
   {
      throw SPxInternalCodeException("XMAISM22 Dimension doesn't match after this step.");
   }

#endif
}